

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

MultiFab * __thiscall NavierStokesBase::get_rho(NavierStokesBase *this,Real time)

{
  TimeLevel TVar1;
  MultiFab *pMVar2;
  
  TVar1 = amrex::AmrLevel::which_time(&this->super_AmrLevel,0,time);
  switch(TVar1) {
  case AmrHalfTime:
    pMVar2 = get_rho_half_time(this);
    return pMVar2;
  case AmrNewTime:
    pMVar2 = &this->rho_ctime;
    break;
  case Amr1QtrTime:
    pMVar2 = this->rho_qtime;
    break;
  case Amr3QtrTime:
    pMVar2 = this->rho_tqtime;
    break;
  default:
    amrex::Error_host("NavierStokesBase::get_rho(): bad time");
  case AmrOldTime:
    pMVar2 = &this->rho_ptime;
  }
  return pMVar2;
}

Assistant:

const MultiFab&
NavierStokesBase::get_rho (Real time)
{
    const TimeLevel whichTime = which_time(State_Type,time);

    if (whichTime == AmrOldTime)
    {
        return rho_ptime;
    }
    else if (whichTime == AmrNewTime)
    {
        return rho_ctime;
    }
    else if (whichTime == Amr1QtrTime)
    {
        AMREX_ASSERT(rho_qtime);
        return *rho_qtime;
    }
    else if (whichTime == Amr3QtrTime)
    {
        AMREX_ASSERT(rho_tqtime);
        return *rho_tqtime;
    }
    else if (whichTime == AmrHalfTime)
    {
        return get_rho_half_time();
    }
    else
    {
        amrex::Error("NavierStokesBase::get_rho(): bad time");
        return rho_ptime; // Got to return something to shut up compiler.
    }
}